

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall t_go_generator::generate_service_interface(t_go_generator *this,t_service *tservice)

{
  string *service_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ofstream_with_content_based_conditional_update *out;
  int *piVar2;
  t_function *tfunction;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  char *__end;
  pointer *ppptVar11;
  ulong uVar12;
  pointer pptVar13;
  undefined8 uVar14;
  char *__end_1;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string extends_if;
  string interfaceName;
  string serviceName;
  vector<t_function_*,_std::allocator<t_function_*>_> local_1f0;
  undefined8 uStack_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  char *local_130;
  long local_128;
  char local_120 [16];
  string local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"","");
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"","");
  iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  service_name = &(this->super_t_generator).service_name_;
  publicize(&local_90,this,(string *)CONCAT44(extraout_var,iVar3),false,service_name);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  if (tservice->extends_ == (t_service *)0x0) goto LAB_0020218c;
  type_name_abi_cxx11_(&local_1d0,this,&tservice->extends_->super_t_type);
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_1d0);
  paVar1 = &local_1d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  lVar4 = std::__cxx11::string::rfind((char *)&local_150,0x3a9598,0xffffffffffffffff);
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  if (lVar4 == -1) {
    t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x3a8a00);
    ppptVar11 = &local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    puVar8 = puVar5 + 2;
    if ((pointer *)*puVar5 == (pointer *)puVar8) {
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
      uStack_1d8 = puVar5[3];
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppptVar11;
    }
    else {
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar5;
    }
    local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    publicize(&local_170,this,&local_150,false,service_name);
    pptVar13 = (pointer)0xf;
    if (local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar11) {
      pptVar13 = local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    }
    if (pptVar13 <
        (pointer)(local_170._M_string_length +
                 (long)local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish)) {
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        uVar14 = local_170.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (pointer)(local_170._M_string_length +
                   (long)local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish)) goto LAB_00202514;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_170,0,(char *)0x0,
                          (ulong)local_1f0.
                                 super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    }
    else {
LAB_00202514:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_170._M_dataplus._M_p)
      ;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    psVar10 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b0._M_string_length = puVar5[1];
    *puVar5 = psVar10;
    puVar5[1] = 0;
    *(undefined1 *)psVar10 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
    psVar10 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1d0.field_2._M_allocated_capacity = *psVar10;
      local_1d0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar10;
      local_1d0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d0._M_string_length = puVar5[1];
    *puVar5 = psVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar11) {
      operator_delete(local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_50._M_dataplus._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_0020218c;
  }
  else {
    t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3a8a00);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_170.field_2._M_allocated_capacity = *puVar8;
      local_170.field_2._8_8_ = puVar5[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *puVar8;
      local_170._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_170._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_190.field_2._M_allocated_capacity = *puVar9;
      local_190.field_2._8_8_ = plVar6[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *puVar9;
      local_190._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_190._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_150);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      uVar14 = local_190.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_e8 + local_190._M_string_length) {
      uVar12 = 0xf;
      if (local_f0 != local_e0) {
        uVar12 = local_e0[0];
      }
      if (uVar12 < local_e8 + local_190._M_string_length) goto LAB_00201f04;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
    }
    else {
LAB_00201f04:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_f0);
    }
    local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
    puVar8 = puVar5 + 2;
    if ((pointer *)*puVar5 == (pointer *)puVar8) {
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
      uStack_1d8 = puVar5[3];
    }
    else {
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar8;
      local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar5;
    }
    local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_150);
    publicize(&local_110,this,&local_70,false,service_name);
    ppptVar11 = &local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pptVar13 = (pointer)0xf;
    if (local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar11) {
      pptVar13 = local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    }
    if (pptVar13 <
        (pointer)(local_110._M_string_length +
                 (long)local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish)) {
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        uVar14 = local_110.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (pointer)(local_110._M_string_length +
                   (long)local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish)) goto LAB_00201ffd;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_110,0,(char *)0x0,
                          (ulong)local_1f0.
                                 super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    }
    else {
LAB_00201ffd:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_110._M_dataplus._M_p)
      ;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    psVar10 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar10;
      local_1b0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b0._M_string_length = puVar5[1];
    *puVar5 = psVar10;
    puVar5[1] = 0;
    *(undefined1 *)psVar10 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1d0.field_2._M_allocated_capacity = *psVar10;
      local_1d0.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar10;
      local_1d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar11) {
      operator_delete(local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0020218c;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_0020218c:
  t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
  out = &this->f_types_;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"type ",5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_d0,local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," interface {",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_130,local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  generate_go_docstring(this,(ostream *)out,(t_doc *)tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_1f0,&tservice->functions_)
  ;
  if ((local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length),
     local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
     super__Vector_impl_data._M_start !=
     local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    ppptVar11 = (pointer *)
                local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    do {
      generate_go_docstring
                (this,(ostream *)out,(t_doc *)*ppptVar11,
                 *(t_struct **)&((t_doc *)*ppptVar11)[2].has_doc_,"Parameters");
      t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      tfunction = (t_function *)*ppptVar11;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
      function_signature_if(&local_1b0,this,tfunction,&local_b0,true);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      ppptVar11 = ppptVar11 + 1;
    } while ((pointer)ppptVar11 !=
             local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::generate_service_interface(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  string serviceName(publicize(tservice->get_name()));
  string interfaceName = serviceName;

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_if = "\n" + indent() + "  " + extends.substr(0, index + 1)
                   + publicize(extends.substr(index + 1)) + "\n";
    } else {
      extends_if = "\n" + indent() + publicize(extends) + "\n";
    }
  }

  f_types_ << indent() << "type " << interfaceName << " interface {" << extends_if;
  indent_up();
  generate_go_docstring(f_types_, tservice);
  vector<t_function*> functions = tservice->get_functions();

  if (!functions.empty()) {
    f_types_ << endl;
    vector<t_function*>::iterator f_iter;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      generate_go_docstring(f_types_, (*f_iter));
      f_types_ << indent() << function_signature_if(*f_iter, "", true) << endl;
    }
  }

  indent_down();
  f_types_ << indent() << "}" << endl << endl;
}